

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::MergeReturnPass::HasNontrivialUnreachableBlocks
          (MergeReturnPass *this,Function *function)

{
  pointer this_00;
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Op OVar4;
  CFG *this_01;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_02;
  pointer bb_00;
  IRContext *this_03;
  Instruction *pIVar5;
  undefined1 local_b8 [24];
  Instruction *local_a0;
  Instruction *inst;
  StructuredCFGAnalysis *struct_cfg_analysis;
  value_type *bb;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  function<void_(spvtools::opt::BasicBlock_*)> local_58;
  undefined1 local_38 [8];
  BitVector reachable_blocks;
  Function *function_local;
  MergeReturnPass *this_local;
  
  reachable_blocks.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)function;
  utils::BitVector::BitVector((BitVector *)local_38,0x400);
  this_01 = Pass::cfg((Pass *)this);
  this_02 = Function::entry((Function *)
                            reachable_blocks.bits_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  bb_00 = std::
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
          get(this_02);
  __range2 = (Function *)local_38;
  std::function<void(spvtools::opt::BasicBlock*)>::
  function<spvtools::opt::MergeReturnPass::HasNontrivialUnreachableBlocks(spvtools::opt::Function*)::__0,void>
            ((function<void(spvtools::opt::BasicBlock*)> *)&local_58,
             (anon_class_8_1_c40d8336 *)&__range2);
  CFG::ForEachBlockInPostOrder(this_01,bb_00,&local_58);
  std::function<void_(spvtools::opt::BasicBlock_*)>::~function(&local_58);
  this_00 = reachable_blocks.bits_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  join_0x00000010_0x00000000_ =
       Function::begin((Function *)
                       reachable_blocks.bits_.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  _bb = Function::end((Function *)this_00);
  do {
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&bb);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_00426b74:
      local_b8._12_4_ = 1;
      utils::BitVector::~BitVector((BitVector *)local_38);
      return this_local._7_1_;
    }
    struct_cfg_analysis =
         (StructuredCFGAnalysis *)
         UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                   ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
    uVar2 = BasicBlock::id((BasicBlock *)struct_cfg_analysis);
    bVar1 = utils::BitVector::Get((BitVector *)local_38,uVar2);
    if (!bVar1) {
      this_03 = Pass::context((Pass *)this);
      pIVar5 = (Instruction *)IRContext::GetStructuredCFGAnalysis(this_03);
      inst = pIVar5;
      uVar2 = BasicBlock::id((BasicBlock *)struct_cfg_analysis);
      bVar1 = StructuredCFGAnalysis::IsContinueBlock((StructuredCFGAnalysis *)pIVar5,uVar2);
      pIVar5 = inst;
      if (bVar1) {
        BasicBlock::begin((BasicBlock *)(local_b8 + 0x10));
        local_a0 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)(local_b8 + 0x10));
        OVar4 = Instruction::opcode(local_a0);
        if (OVar4 != OpBranch) {
          this_local._7_1_ = true;
          goto LAB_00426b74;
        }
        uVar2 = Instruction::GetSingleWordInOperand(local_a0,0);
        pIVar5 = inst;
        uVar3 = BasicBlock::id((BasicBlock *)struct_cfg_analysis);
        uVar3 = StructuredCFGAnalysis::ContainingLoop((StructuredCFGAnalysis *)pIVar5,uVar3);
        if (uVar2 != uVar3) {
          this_local._7_1_ = true;
          goto LAB_00426b74;
        }
      }
      else {
        uVar2 = BasicBlock::id((BasicBlock *)struct_cfg_analysis);
        bVar1 = StructuredCFGAnalysis::IsMergeBlock((StructuredCFGAnalysis *)pIVar5,uVar2);
        if (!bVar1) {
          this_local._7_1_ = true;
          goto LAB_00426b74;
        }
        BasicBlock::begin((BasicBlock *)local_b8);
        pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)local_b8);
        OVar4 = Instruction::opcode(pIVar5);
        if (OVar4 != OpUnreachable) {
          this_local._7_1_ = true;
          goto LAB_00426b74;
        }
      }
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  } while( true );
}

Assistant:

bool MergeReturnPass::HasNontrivialUnreachableBlocks(Function* function) {
  utils::BitVector reachable_blocks;
  cfg()->ForEachBlockInPostOrder(
      function->entry().get(),
      [&reachable_blocks](BasicBlock* bb) { reachable_blocks.Set(bb->id()); });

  for (auto& bb : *function) {
    if (reachable_blocks.Get(bb.id())) {
      continue;
    }

    StructuredCFGAnalysis* struct_cfg_analysis =
        context()->GetStructuredCFGAnalysis();
    if (struct_cfg_analysis->IsContinueBlock(bb.id())) {
      // |bb| must be an empty block ending with a branch to the header.
      Instruction* inst = &*bb.begin();
      if (inst->opcode() != spv::Op::OpBranch) {
        return true;
      }

      if (inst->GetSingleWordInOperand(0) !=
          struct_cfg_analysis->ContainingLoop(bb.id())) {
        return true;
      }
    } else if (struct_cfg_analysis->IsMergeBlock(bb.id())) {
      // |bb| must be an empty block ending with OpUnreachable.
      if (bb.begin()->opcode() != spv::Op::OpUnreachable) {
        return true;
      }
    } else {
      return true;
    }
  }
  return false;
}